

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadEscape
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  EncodedCharPtr puVar5;
  byte *pbVar6;
  char *pcVar7;
  uint uVar8;
  char16 ch;
  codepoint_t cVar9;
  uint uVar10;
  int local_38;
  undefined4 local_34;
  
  pcVar7 = (char *)outChar;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    pcVar7 = "outChar != nullptr";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10c,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar2) goto LAB_00d57866;
    *puVar4 = 0;
  }
  puVar5 = *startingLocation;
  if (endOfSource < puVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    pcVar7 = "startingLocation <= endOfSource";
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x10d,"(startingLocation <= endOfSource)","startingLocation <= endOfSource")
    ;
    if (!bVar2) goto LAB_00d57866;
    *puVar4 = 0;
    puVar5 = *startingLocation;
  }
  if ((puVar5 < endOfSource) && (*puVar5 == 'u')) {
    pbVar6 = puVar5 + 1;
    if ((pbVar6 < endOfSource) && ((*pbVar6 == 0x7b && (this->es6UnicodeMode != false)))) {
      pbVar6 = puVar5 + 2;
      uVar10 = 0xffffffff;
      local_34 = (undefined4)CONCAT71((int7)((ulong)pcVar7 >> 8),1);
    }
    else {
      uVar10 = 4;
      local_34 = 0;
    }
    local_38 = 0;
    cVar9 = 0;
    uVar8 = 0;
    ch = L'\0';
    while( true ) {
      if ((uVar10 <= uVar8) || (endOfSource <= pbVar6)) goto LAB_00d577c4;
      ch = (char16)*pbVar6;
      BVar3 = Js::NumberUtilities::FHexDigit(ch,&local_38);
      if (BVar3 == 0) break;
      cVar9 = cVar9 * 0x10 + local_38;
      if (0x10ffff < cVar9) {
        return false;
      }
      pbVar6 = pbVar6 + 1;
      uVar8 = uVar8 + 1;
    }
    pbVar6 = pbVar6 + 1;
LAB_00d577c4:
    if (uVar8 == 0) {
      return false;
    }
    if (uVar8 == 4) {
      if ((char)local_34 == '\0') goto LAB_00d57843;
    }
    else if ((char)local_34 == '\0') {
      return false;
    }
    if (this->es6UnicodeMode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                         ,0x13c,"(expectCurly ? es6UnicodeMode : true)",
                         "expectCurly ? es6UnicodeMode : true");
      if (!bVar2) {
LAB_00d57866:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    if (ch == L'}') {
LAB_00d57843:
      *outChar = cVar9;
      *startingLocation = pbVar6;
      return true;
    }
  }
  return false;
}

Assistant:

bool Scanner<EncodingPolicy>::TryReadEscape(EncodedCharPtr& startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar)
{
    Assert(outChar != nullptr);
    Assert(startingLocation <= endOfSource);

    EncodedCharPtr currentLocation = startingLocation;
    codepoint_t charToOutput = 0x0;

    // '\' is Assumed as there is only one caller
    // Read 'u' characters
    if (currentLocation >= endOfSource || this->ReadFirst(currentLocation, endOfSource) != 'u')
    {
        return false;
    }

    bool expectCurly = false;

    if (currentLocation < endOfSource && this->PeekFirst(currentLocation, endOfSource) == '{' && es6UnicodeMode)
    {
        expectCurly = true;
        // Move past the character
        this->ReadFirst(currentLocation, endOfSource);
    }

    uint i = 0;
    OLECHAR ch = 0;
    int hexValue = 0;
    uint maxHexDigits = (expectCurly ? MAXUINT32 : 4u);

    for(; i < maxHexDigits && currentLocation < endOfSource; i++)
    {
        if (!Js::NumberUtilities::FHexDigit(ch = this->ReadFirst(currentLocation, endOfSource), &hexValue))
        {
            break;
        }

        charToOutput = charToOutput * 0x10 + hexValue;

        if (charToOutput > 0x10FFFF)
        {
            return false;
        }
    }

    //At least 4 characters have to be read
    if (i == 0 || (i != 4 && !expectCurly))
    {
        return false;
    }

    Assert(expectCurly ? es6UnicodeMode : true);

    if (expectCurly && ch != '}')
    {
        return false;
    }

    *outChar = charToOutput;
    startingLocation = currentLocation;
    return true;
}